

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveProxy.cpp
# Opt level: O0

bool __thiscall
aeron::archive::ArchiveProxy::stopRecording
          (ArchiveProxy *this,string *channel,int32_t streamId,int64_t correlationId,
          int64_t controlSessionId)

{
  bool bVar1;
  StopRecordingRequest *pSVar2;
  uint64_t uVar3;
  undefined1 local_68 [8];
  StopRecordingRequest msg;
  int64_t controlSessionId_local;
  int64_t correlationId_local;
  int32_t streamId_local;
  string *channel_local;
  ArchiveProxy *this_local;
  
  msg.m_actingVersion = controlSessionId;
  io::aeron::archive::codecs::StopRecordingRequest::StopRecordingRequest
            ((StopRecordingRequest *)local_68);
  pSVar2 = wrapAndApplyHeader<io::aeron::archive::codecs::StopRecordingRequest>
                     (this,(StopRecordingRequest *)local_68);
  pSVar2 = io::aeron::archive::codecs::StopRecordingRequest::controlSessionId
                     (pSVar2,msg.m_actingVersion);
  pSVar2 = io::aeron::archive::codecs::StopRecordingRequest::correlationId(pSVar2,correlationId);
  pSVar2 = io::aeron::archive::codecs::StopRecordingRequest::streamId(pSVar2,streamId);
  io::aeron::archive::codecs::StopRecordingRequest::putChannel(pSVar2,channel);
  uVar3 = io::aeron::archive::codecs::StopRecordingRequest::encodedLength
                    ((StopRecordingRequest *)local_68);
  bVar1 = offer(this,(int32_t)uVar3);
  return bVar1;
}

Assistant:

bool ArchiveProxy::stopRecording(const std::string& channel, std::int32_t streamId, std::int64_t correlationId,
                                 std::int64_t controlSessionId) {
    codecs::StopRecordingRequest msg;

    wrapAndApplyHeader(msg)
        .controlSessionId(controlSessionId)
        .correlationId(correlationId)
        .streamId(streamId)
        .putChannel(channel);

    return offer(msg.encodedLength());
}